

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O3

void __thiscall
TCV::checkIfClassFunctionCalledWithRightAccess
          (TCV *this,string *nodeName,ASTNode *_node,bool isCalledOnFunction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  ASTNode *pAVar4;
  string *varName;
  Variable *this_00;
  Class *this_01;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  const_iterator cVar5;
  Function *pFVar6;
  undefined3 in_register_00000009;
  string errorString;
  string objectType;
  mapped_type functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  vector<Function_*,_std::allocator<Function_*>_> local_48;
  
  pAVar4 = AST::ASTNode::getParent(_node);
  pAVar4 = AST::ASTNode::getChild(pAVar4,lastProcessedNode);
  pAVar4 = AST::ASTNode::getChild(pAVar4,0);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (CONCAT31(in_register_00000009,isCalledOnFunction) == 0) {
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
LAB_0013096d:
    iVar3 = std::__cxx11::string::compare((char *)&this->currentFuncName);
    if (iVar3 == 0) {
      pFVar6 = this->symbolTable->main;
      varName = AST::ASTNode::getName_abi_cxx11_(pAVar4);
    }
    else {
      pFVar6 = this->currentFunction;
      varName = AST::ASTNode::getName_abi_cxx11_(pAVar4);
    }
    this_00 = Function::getVariable(pFVar6,varName);
    Variable::getType_abi_cxx11_(this_00);
    std::__cxx11::string::_M_assign((string *)&local_68);
  }
  else {
    pcVar2 = (this->returnType)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + (this->returnType)._M_string_length);
    if (local_68._M_string_length == 0) goto LAB_0013096d;
  }
  this_01 = Semantic::SymbolTable::getClass(this->symbolTable,&local_68);
  this_02 = &Class::getFunctions_abi_cxx11_(this_01)->_M_h;
  cVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_02,nodeName);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  std::vector<Function_*,_std::allocator<Function_*>_>::vector
            (&local_48,
             (vector<Function_*,_std::allocator<Function_*>_> *)
             ((long)cVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
                    ._M_cur + 0x28));
  pFVar6 = getRightFunction(this,&local_48,_node);
  if (pFVar6 == (Function *)0x0) {
    std::operator+(&local_88,"no matching function name ",nodeName);
    Semantic::Detector::addError(this->detector,&local_88);
  }
  else {
    if (pFVar6->visibility != PRIVATE) {
      Function::getReturnType_abi_cxx11_(pFVar6);
      std::__cxx11::string::_M_assign((string *)&this->returnType);
      goto LAB_00130a8a;
    }
    std::operator+(&local_88,"Accessing private function name ",nodeName);
    Semantic::Detector::addError(this->detector,&local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_00130a8a:
  if (local_48.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
TCV::checkIfClassFunctionCalledWithRightAccess(std::string &nodeName, AST::ASTNode *_node, bool isCalledOnFunction) {
    auto object = _node->getParent()->getChild(lastProcessedNode)->getChild(0);

    //if there is a chain of function calls, the return type
    //of the last processed function is the object type that
    //next function should be called on.
    std::string objectType = isCalledOnFunction ? returnType : std::string();

    //if in main function scope, we need to fetch main function local variable
    if (objectType.empty()) {
        if (currentFuncName == "main") objectType = symbolTable->main->getVariable(object->getName())->getType();
        else objectType = currentFunction->getVariable(object->getName())->getType();
    }
    auto functions = symbolTable->getClass(objectType)->getFunctions().at(nodeName);

    auto function = getRightFunction(functions, _node);
    if (function != nullptr && function->isPrivate()) {
        std::string errorString = "Accessing private function name " + nodeName;
        detector->addError(errorString);
    } else if (function == nullptr) {
        std::string errorString = "no matching function name " + nodeName;
        detector->addError(errorString);
    } else returnType = function->getReturnType();

}